

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_duck_schema.cpp
# Opt level: O0

unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true>
duckdb::ArrowType::GetTypeFromSchema(DBConfig *config,ArrowSchema *schema)

{
  undefined1 uVar1;
  bool bVar2;
  undefined8 *in_RDX;
  shared_ptr<duckdb::ArrowTypeExtensionData,_true> *in_RSI;
  ArrowExtensionMetadata *in_RDI;
  ArrowTypeExtension extension;
  ArrowExtensionMetadata extension_info;
  ArrowSchemaMetadata schema_metadata;
  string format;
  unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true> *arrow_type;
  ArrowTypeExtension *in_stack_fffffffffffffcb8;
  ArrowTypeExtension *in_stack_fffffffffffffcc0;
  shared_ptr<duckdb::ArrowTypeExtensionData,_true> *other;
  undefined7 in_stack_fffffffffffffce8;
  _Head_base<0UL,_duckdb::ArrowType_*,_false> schema_metadata_00;
  ArrowSchema *schema_00;
  ArrowTypeExtension *this;
  element_type *in_stack_fffffffffffffd20;
  ArrowExtensionMetadata *in_stack_fffffffffffffd80;
  DBConfig *in_stack_fffffffffffffd88;
  char *in_stack_fffffffffffffdf8;
  ArrowSchemaMetadata *in_stack_fffffffffffffe00;
  ArrowExtensionMetadata *in_stack_fffffffffffffe10;
  DBConfig *in_stack_fffffffffffffe18;
  string *in_stack_fffffffffffffe20;
  ArrowSchemaMetadata *in_stack_fffffffffffffe28;
  string local_138 [167];
  undefined1 local_91;
  undefined1 local_39 [41];
  shared_ptr<duckdb::ArrowTypeExtensionData,_true> *local_10;
  
  schema_00 = (ArrowSchema *)*in_RDX;
  this = (ArrowTypeExtension *)local_39;
  schema_metadata_00._M_head_impl = (ArrowType *)in_RDI;
  local_10 = in_RSI;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)(local_39 + 1),(char *)schema_00,(allocator *)this);
  ::std::allocator<char>::~allocator((allocator<char> *)local_39);
  ArrowSchemaMetadata::ArrowSchemaMetadata(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  local_91 = 0;
  GetTypeFromFormat((DBConfig *)format.field_2._8_8_,
                    (ArrowSchema *)format.field_2._M_allocated_capacity,
                    (string *)format._M_string_length);
  uVar1 = ArrowSchemaMetadata::HasExtension((ArrowSchemaMetadata *)in_stack_fffffffffffffd20);
  if ((bool)uVar1) {
    ::std::__cxx11::string::string(local_138,(string *)(local_39 + 1));
    ArrowSchemaMetadata::GetExtensionInfo(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
    ::std::__cxx11::string::~string(local_138);
    ArrowExtensionMetadata::ArrowExtensionMetadata
              (in_RDI,(ArrowExtensionMetadata *)CONCAT17(uVar1,in_stack_fffffffffffffce8));
    bVar2 = DBConfig::HasArrowExtension(in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
    ArrowExtensionMetadata::~ArrowExtensionMetadata
              ((ArrowExtensionMetadata *)in_stack_fffffffffffffcc0);
    if (bVar2) {
      ArrowExtensionMetadata::ArrowExtensionMetadata
                (in_RDI,(ArrowExtensionMetadata *)CONCAT17(uVar1,in_stack_fffffffffffffce8));
      DBConfig::GetArrowExtension(in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
      ArrowExtensionMetadata::~ArrowExtensionMetadata
                ((ArrowExtensionMetadata *)in_stack_fffffffffffffcc0);
      ArrowTypeExtension::GetType
                (this,schema_00,(ArrowSchemaMetadata *)schema_metadata_00._M_head_impl);
      other = (shared_ptr<duckdb::ArrowTypeExtensionData,_true> *)&stack0xfffffffffffffd20;
      unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true>::operator=
                ((unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true> *)
                 in_stack_fffffffffffffcc0,
                 (unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true> *)
                 in_stack_fffffffffffffcb8);
      unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true>::~unique_ptr
                ((unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true> *)
                 0x1a277da);
      ArrowTypeExtension::GetTypeExtension(in_stack_fffffffffffffcb8);
      in_stack_fffffffffffffcc0 =
           (ArrowTypeExtension *)
           unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true>::operator->
                     ((unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true> *
                      )in_stack_fffffffffffffcc0);
      shared_ptr<duckdb::ArrowTypeExtensionData,_true>::operator=(local_10,other);
      shared_ptr<duckdb::ArrowTypeExtensionData,_true>::~shared_ptr
                ((shared_ptr<duckdb::ArrowTypeExtensionData,_true> *)0x1a27818);
      ArrowTypeExtension::~ArrowTypeExtension(in_stack_fffffffffffffcc0);
    }
    ArrowExtensionMetadata::~ArrowExtensionMetadata
              ((ArrowExtensionMetadata *)in_stack_fffffffffffffcc0);
  }
  local_91 = 1;
  ArrowSchemaMetadata::~ArrowSchemaMetadata((ArrowSchemaMetadata *)in_stack_fffffffffffffcc0);
  ::std::__cxx11::string::~string((string *)(local_39 + 1));
  return (unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>)
         (_Tuple_impl<0UL,_duckdb::ArrowType_*,_std::default_delete<duckdb::ArrowType>_>)
         schema_metadata_00._M_head_impl;
}

Assistant:

unique_ptr<ArrowType> ArrowType::GetTypeFromSchema(DBConfig &config, ArrowSchema &schema) {
	auto format = string(schema.format);
	// Let's first figure out if this type is an extension type
	ArrowSchemaMetadata schema_metadata(schema.metadata);
	auto arrow_type = GetTypeFromFormat(config, schema, format);
	if (schema_metadata.HasExtension()) {
		auto extension_info = schema_metadata.GetExtensionInfo(string(format));
		if (config.HasArrowExtension(extension_info)) {
			auto extension = config.GetArrowExtension(extension_info);
			arrow_type = extension.GetType(schema, schema_metadata);
			arrow_type->extension_data = extension.GetTypeExtension();
		}
	}

	return arrow_type;
}